

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pure.cpp
# Opt level: O3

string * fs_file_name_abi_cxx11_(string_view path)

{
  uint uVar1;
  long lVar2;
  _List *p_Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  path *this;
  allocator<char> local_79;
  path local_78;
  path local_50;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  this = &local_78;
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (this,&local_28,auto_format);
  if (local_78._M_pathname._M_string_length != 0) {
    uVar1 = local_78._32_4_;
    if ((~local_78._M_cmpts & 3) == 0) {
LAB_00113c1d:
      std::filesystem::__cxx11::path::path(&local_50,this);
      goto LAB_00113c36;
    }
    if (((local_78._32_8_ & 3) == 0) &&
       (local_78._M_pathname._M_dataplus._M_p[local_78._M_pathname._M_string_length - 1] != '/')) {
      if ((local_78._32_8_ & 3) == 0) {
        lVar2 = std::filesystem::__cxx11::path::_List::end();
        this = (path *)(lVar2 + -0x30);
        p_Var3 = (_List *)(lVar2 + -0x10);
        if ((local_78._32_8_ & 3) != 0) {
          p_Var3 = &local_78._M_cmpts;
          this = &local_78;
        }
        uVar1 = (uint)*(undefined8 *)p_Var3;
      }
      else {
        this = &local_78;
      }
      if ((~uVar1 & 3) == 0) goto LAB_00113c1d;
    }
  }
  std::filesystem::__cxx11::path::path(&local_50);
LAB_00113c36:
  std::filesystem::__cxx11::path::generic_string<char,std::char_traits<char>,std::allocator<char>>
            (in_RDI,&local_50,&local_79);
  std::filesystem::__cxx11::path::~path(&local_50);
  std::filesystem::__cxx11::path::~path(&local_78);
  return in_RDI;
}

Assistant:

std::string fs_file_name(std::string_view path)
{
#ifdef HAVE_CXX_FILESYSTEM
  return std::filesystem::path(path).filename().generic_string();
#else

  const auto i = path.find_last_of(fs_is_windows() ? "/\\" : "/");

  return (i != std::string::npos)
    ? std::string(path.substr(i + 1))
    : std::string(path);
#endif
}